

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ForkJoin.cpp
# Opt level: O0

ComponentSet __thiscall amrex::ForkJoin::ComponentBounds(ForkJoin *this,string *name,int idx)

{
  ComponentSet *pCVar1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>_>_>
  *in_RDI;
  mapped_type *mffork_vec;
  key_type *in_stack_ffffffffffffffc8;
  
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>_>_>
  ::at(in_RDI,in_stack_ffffffffffffffc8);
  Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>::operator[]
            ((Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_> *)in_RDI,
             (size_type)in_stack_ffffffffffffffc8);
  pCVar1 = Vector<amrex::ForkJoin::ComponentSet,_std::allocator<amrex::ForkJoin::ComponentSet>_>::
           operator[]((Vector<amrex::ForkJoin::ComponentSet,_std::allocator<amrex::ForkJoin::ComponentSet>_>
                       *)in_RDI,(size_type)in_stack_ffffffffffffffc8);
  return *pCVar1;
}

Assistant:

ForkJoin::ComponentSet
ForkJoin::ComponentBounds(const std::string& name, int idx) const
{
    const auto & mffork_vec = data.at(name);
    BL_ASSERT(idx >= 0 && idx < mffork_vec.size());
    return mffork_vec[idx].comp_split[task_me];
}